

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadList.h
# Opt level: O0

NodePosi __thiscall
QuadList<SSTableDataEntry>::insertAfterAbove
          (QuadList<SSTableDataEntry> *this,SSTableDataEntry *data,NodePosi pred_node,
          NodePosi below_node)

{
  QuadListNode<SSTableDataEntry> *this_00;
  SSTableDataEntry local_70;
  QuadListNode<SSTableDataEntry> *local_30;
  Node *new_node;
  NodePosi below_node_local;
  NodePosi pred_node_local;
  SSTableDataEntry *data_local;
  QuadList<SSTableDataEntry> *this_local;
  
  new_node = below_node;
  below_node_local = pred_node;
  pred_node_local = (NodePosi)data;
  data_local = (SSTableDataEntry *)this;
  this_00 = (QuadListNode<SSTableDataEntry> *)operator_new(0x60);
  SSTableDataEntry::SSTableDataEntry(&local_70,data);
  QuadListNode<SSTableDataEntry>::QuadListNode
            (this_00,&local_70,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0,(QuadListNode<SSTableDataEntry> *)0x0,
             (QuadListNode<SSTableDataEntry> *)0x0);
  SSTableDataEntry::~SSTableDataEntry(&local_70);
  local_30 = this_00;
  QuadListNode<SSTableDataEntry>::insertAfterSucc(below_node_local,this_00,new_node);
  this->_size = this->_size + 1;
  return local_30;
}

Assistant:

auto QuadList<T>::insertAfterAbove(T data, NodePosi pred_node, NodePosi below_node) {
    auto *new_node = new Node(data);
    pred_node->insertAfterSucc(new_node, below_node);
    _size++;
    return const_cast<const NodePosi &>(new_node);
}